

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.h
# Opt level: O0

void __thiscall SQTable::~SQTable(SQTable *this)

{
  SQDelegable *in_RDI;
  SQInteger i;
  SQTable *in_stack_fffffffffffffff0;
  _HashNode *this_00;
  
  (in_RDI->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQTable_001572d8;
  SQDelegable::SetDelegate(in_RDI,in_stack_fffffffffffffff0);
  if (((in_RDI->super_SQCollectable).super_SQRefCounted._uiRef & 0x80000000) == 0) {
    SQCollectable::RemoveFromChain
              (&((in_RDI->super_SQCollectable)._sharedstate)->_gc_chain,
               (SQCollectable_conflict *)in_RDI);
  }
  for (this_00 = (_HashNode *)0x0;
      (long)this_00 < (long)in_RDI[1].super_SQCollectable.super_SQRefCounted._weakref;
      this_00 = (_HashNode *)((long)&(this_00->val).super_SQObject._type + 1)) {
    _HashNode::~_HashNode(this_00);
  }
  sq_vm_free(this_00,(SQUnsignedInteger)in_RDI);
  SQDelegable::~SQDelegable((SQDelegable *)0x12d719);
  return;
}

Assistant:

~SQTable()
    {
        SetDelegate(NULL);
        REMOVE_FROM_CHAIN(&_sharedstate->_gc_chain, this);
        for (SQInteger i = 0; i < _numofnodes; i++) _nodes[i].~_HashNode();
        SQ_FREE(_nodes, _numofnodes * sizeof(_HashNode));
    }